

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMDP.cpp
# Opt level: O2

void __thiscall
QMDP::QMDP(QMDP *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,bool useJaohQValuesCache)

{
  *(undefined ***)&this->field_0x18 = &PTR__QFunctionForDecPOMDPInterface_005d4ee0;
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            ((QFunctionForDecPOMDP *)&this->field_0x50,&PTR_construction_vtable_128__005d4b40,pu);
  QFunctionJAOH::QFunctionJAOH
            ((QFunctionJAOH *)&this->field_0x18,&PTR_construction_vtable_152__005d4af8,pu);
  QFunctionJointBeliefInterface::QFunctionJointBeliefInterface
            ((QFunctionJointBeliefInterface *)this,&PTR_construction_vtable_144__005d4b68);
  *(undefined8 *)&this->field_0x18 = 0x5d4968;
  *(undefined8 *)&this->field_0x50 = 0x5d4a60;
  *(undefined8 *)this = 0x5d4848;
  this->_m_p = (MDPSolver *)0x0;
  this->_m_initialized = false;
  this->_m_useJaohQValuesCache = useJaohQValuesCache;
  return;
}

Assistant:

QMDP::QMDP(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
           bool useJaohQValuesCache) :
    QFunctionForDecPOMDP(pu), //virtual base first
    QFunctionJAOH(pu),
    _m_p(0),
    _m_initialized(false),
    _m_useJaohQValuesCache(useJaohQValuesCache)
{
}